

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

FeatureType __thiscall
CoreML::FeatureType::Dictionary(FeatureType *this,MLDictionaryFeatureTypeKeyType keyType)

{
  DictionaryFeatureType *this_00;
  runtime_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  FeatureType FVar2;
  
  FeatureType(this,MLFeatureTypeType_dictionaryType);
  this_00 = Specification::FeatureType::mutable_dictionarytype
                      ((this->m_type).
                       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  if (keyType == MLDictionaryFeatureTypeKeyType_int64KeyType) {
    Specification::DictionaryFeatureType::mutable_int64keytype(this_00);
    _Var1._M_pi = extraout_RDX_01;
  }
  else if (keyType == MLDictionaryFeatureTypeKeyType_stringKeyType) {
    Specification::DictionaryFeatureType::mutable_stringkeytype(this_00);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    _Var1._M_pi = extraout_RDX;
    if (keyType == MLDictionaryFeatureTypeKeyType_NOT_SET) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"Invalid dictionary key type. Expected one of: {int64, string}.");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  FVar2.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  FVar2.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (FeatureType)
         FVar2.m_type.
         super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FeatureType FeatureType::Dictionary(MLDictionaryFeatureTypeKeyType keyType) {
        FeatureType out(MLFeatureTypeType_dictionaryType);

        Specification::DictionaryFeatureType *params = out->mutable_dictionarytype();
        
        switch (keyType) {
            case MLDictionaryFeatureTypeKeyType_int64KeyType:
                params->mutable_int64keytype();
                break;
            case MLDictionaryFeatureTypeKeyType_stringKeyType:
                params->mutable_stringkeytype();
                break;
            case MLDictionaryFeatureTypeKeyType_NOT_SET:
                throw std::runtime_error("Invalid dictionary key type. Expected one of: {int64, string}.");
        }

        return out;
    }